

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O3

AssertionItemPortSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *this,size_t index)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  
  if ((this->elements).size_ <= index * 2) {
    std::terminate();
  }
  ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                       ((this->elements).data_ + index * 2));
  if ((((AssertionItemPortSyntax *)*ppSVar1)->super_SyntaxNode).kind == AssertionItemPort) {
    return (AssertionItemPortSyntax *)*ppSVar1;
  }
  assert::assertFailed
            ("T::isKind(kind)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
             ,0x68,"T &slang::syntax::SyntaxNode::as() [T = slang::syntax::AssertionItemPortSyntax]"
            );
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }